

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O2

void rehashtab(lua_State *L,GCtab *t,cTValue *ek)

{
  uint64_t uVar1;
  uint32_t i;
  uint32_t uVar2;
  int iVar3;
  long lVar4;
  uint32_t b;
  uint32_t hbits;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  uint32_t bins [28];
  
  for (lVar4 = 0; lVar4 != 0x1c; lVar4 = lVar4 + 1) {
    bins[lVar4] = 0;
  }
  uVar11 = t->asize;
  uVar12 = 0;
  iVar13 = 0;
  if (uVar11 != 0) {
    lVar4 = 0;
    iVar13 = 0;
    uVar5 = 0;
    while ((uVar6 = (uint)uVar5, lVar4 != 0x1c &&
           ((uVar7 = 2 << ((byte)lVar4 & 0x1f), uVar7 < uVar11 ||
            (uVar7 = uVar11 - 1, uVar6 <= uVar11 - 1))))) {
      uVar8 = uVar7 + 1;
      if (uVar7 + 1 < uVar6) {
        uVar8 = uVar6;
      }
      iVar9 = 0;
      for (; uVar8 != (uint)uVar5; uVar5 = (ulong)((uint)uVar5 + 1)) {
        iVar9 = iVar9 + (uint)(*(long *)((t->array).ptr64 + uVar5 * 8) != -1);
      }
      bins[lVar4] = bins[lVar4] + iVar9;
      iVar13 = iVar13 + iVar9;
      lVar4 = lVar4 + 1;
      uVar5 = (ulong)uVar8;
    }
  }
  uVar11 = t->hmask;
  uVar1 = (t->node).ptr64;
  iVar9 = 0;
  iVar14 = 0;
  for (; uVar12 <= uVar11; uVar12 = uVar12 + 1) {
    if (*(long *)(uVar1 + (ulong)uVar12 * 0x18) != -1) {
      uVar2 = countint((cTValue *)((ulong)uVar12 * 0x18 + uVar1 + 8),bins);
      iVar9 = iVar9 + uVar2;
      iVar14 = iVar14 + 1;
    }
  }
  uVar2 = countint(ek,bins);
  iVar3 = uVar2 + iVar9 + iVar13;
  iVar10 = 0;
  iVar9 = 0;
  uVar2 = 0;
  uVar5 = 0;
  while( true ) {
    uVar11 = 1 << ((byte)uVar5 & 0x1f);
    if (((uint)(iVar3 * 2) <= uVar11) || (iVar10 == iVar3)) break;
    if ((bins[uVar5] != 0) && (iVar10 = bins[uVar5] + iVar10, uVar11 < (uint)(iVar10 * 2))) {
      uVar2 = (2 << ((byte)uVar5 & 0x1f)) + 1;
      iVar9 = iVar10;
    }
    uVar5 = (ulong)((int)uVar5 + 1);
  }
  iVar9 = (iVar13 + iVar14 + 1) - iVar9;
  hbits = 0;
  if ((iVar9 != 0) && (hbits = 1, iVar9 != 1)) {
    uVar11 = 0x1f;
    if (iVar9 - 1U != 0) {
      for (; iVar9 - 1U >> uVar11 == 0; uVar11 = uVar11 - 1) {
      }
    }
    hbits = (uVar11 ^ 0xffffffe0) + 0x21;
  }
  lj_tab_resize(L,t,uVar2,hbits);
  return;
}

Assistant:

static void rehashtab(lua_State *L, GCtab *t, cTValue *ek)
{
  uint32_t bins[LJ_MAX_ABITS];
  uint32_t total, asize, na, i;
  for (i = 0; i < LJ_MAX_ABITS; i++) bins[i] = 0;
  asize = countarray(t, bins);
  total = 1 + asize;
  total += counthash(t, bins, &asize);
  asize += countint(ek, bins);
  na = bestasize(bins, &asize);
  total -= na;
  lj_tab_resize(L, t, asize, hsize2hbits(total));
}